

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  short sVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  U32 tableMask;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  ushort auStack_a8 [24];
  U16 symbolNext [53];
  
  uVar7 = 1;
  bVar3 = (byte)tableLog;
  uVar9 = 1 << (bVar3 & 0x1f);
  uVar2 = uVar9 - 1;
  uVar6 = maxSymbolValue + 1;
  uVar5 = uVar2;
  if (uVar6 != 0) {
    uVar11 = 0;
    uVar13 = (ulong)uVar2;
    do {
      uVar12 = normalizedCounter[uVar11];
      if ((short)uVar12 == -1) {
        dt[uVar13 + 1].baseValue = (U32)uVar11;
        uVar12 = 1;
        uVar13 = (ulong)((int)uVar13 - 1);
      }
      else if ((0x10000 << (bVar3 - 1 & 0x1f)) >> 0x10 <= (int)(short)uVar12) {
        uVar7 = 0;
      }
      uVar5 = (uint)uVar13;
      auStack_a8[uVar11] = uVar12;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  dt->nextState = (short)uVar7;
  dt->nbAdditionalBits = (char)((uint)uVar7 >> 0x10);
  dt->nbBits = (char)((uint)uVar7 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar6 != 0) {
    uVar13 = 0;
    uVar8 = 0;
    do {
      sVar1 = normalizedCounter[uVar13];
      if (0 < sVar1) {
        iVar10 = 0;
        do {
          dt[(ulong)uVar8 + 1].baseValue = (U32)uVar13;
          do {
            uVar8 = uVar8 + (uVar9 >> 3) + (uVar9 >> 1) + 3 & uVar2;
          } while (uVar5 < uVar8);
          iVar10 = iVar10 + 1;
        } while (iVar10 != sVar1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  uVar13 = 0;
  do {
    uVar2 = dt[uVar13 + 1].baseValue;
    uVar12 = auStack_a8[uVar2];
    auStack_a8[uVar2] = uVar12 + 1;
    iVar10 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    bVar4 = bVar3 - (char)iVar10;
    dt[uVar13 + 1].nbBits = bVar4;
    dt[uVar13 + 1].nextState = (uVar12 << (bVar4 & 0x1f)) - (short)uVar9;
    dt[uVar13 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar2];
    dt[uVar13 + 1].baseValue = baseValue[uVar2];
    uVar13 = uVar13 + 1;
  } while (uVar9 != uVar13);
  return;
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}